

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::DontMultOut(EExpr *__return_storage_ptr__,
             ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *this,EExpr *el,EExpr *er)

{
  bool bVar1;
  int iVar2;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  allocator_type local_243;
  allocator_type local_242;
  allocator_type local_241;
  int local_240;
  int local_23c;
  _Vector_base<int,_std::allocator<int>_> local_238;
  _Vector_base<int,_std::allocator<int>_> local_220;
  _Vector_base<double,_std::allocator<double>_> local_208;
  double local_1f0;
  LinTerms local_1e8;
  QuadTerms local_170;
  
  QuadAndLinTerms::sort_terms((QuadAndLinTerms *)el);
  QuadAndLinTerms::sort_terms((QuadAndLinTerms *)er);
  iVar2 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::Convert2Var(&(this->flat_cvt_).
                         super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        ,&el->super_QuadraticExpr);
  local_240 = iVar2;
  if (el != er) {
    bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::operator==
                      (&el->super_QuadraticExpr,&er->super_QuadraticExpr);
    if (!bVar1) {
      local_240 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ::Convert2Var(&(this->flat_cvt_).
                                 super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                ,&er->super_QuadraticExpr);
    }
  }
  local_1e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_1e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
  local_1e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[2] =
       (type)0x0;
  local_1e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[3] =
       (type)0x0;
  local_1e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[4] =
       (type)0x0;
  local_1e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[5] =
       (type)0x0;
  local_1e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  local_1e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[0] =
       (type)0x0;
  local_1e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[1] =
       (type)0x0;
  local_1e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[4] =
       (type)0x0;
  local_1e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[5] =
       (type)0x0;
  local_1e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[2] =
       (type)0x0;
  local_1e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[3] =
       (type)0x0;
  local_1e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[0] =
       (type)0x0;
  local_1e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[1] =
       (type)0x0;
  local_1e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  local_1e8.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  local_1e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  local_1e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_1e8.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  local_1f0 = 1.0;
  __l._M_len = 1;
  __l._M_array = &local_1f0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_208,__l,&local_241);
  __l_00._M_len = 1;
  __l_00._M_array = &local_23c;
  local_23c = iVar2;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_220,__l_00,&local_242);
  __l_01._M_len = 1;
  __l_01._M_array = &local_240;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_238,__l_01,&local_243);
  QuadTerms::QuadTerms
            (&local_170,(vector<double,_std::allocator<double>_> *)&local_208,
             (vector<int,_std::allocator<int>_> *)&local_220,
             (vector<int,_std::allocator<int>_> *)&local_238);
  EExpr::EExpr(__return_storage_ptr__,&local_1e8,&local_170,0.0);
  QuadTerms::~QuadTerms(&local_170);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_238);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_220);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_208);
  LinTerms::~LinTerms(&local_1e8);
  return __return_storage_ptr__;
}

Assistant:

EExpr DontMultOut(EExpr&& el, EExpr&& er) {
    const auto& ellt = el.GetLinTerms();
    const auto& erlt = er.GetLinTerms();
    assert(el.is_affine() && er.is_affine()
           && ellt.size() && erlt.size());
    el.sort_terms();
    er.sort_terms();
    auto resvar1 = Convert2Var( std::move(el) );
    auto resvar2 = (&el==&er || el==er)
                       ? resvar1 : Convert2Var( std::move(er) );
    return {                         // = el*er+0, inlined  #260
            LinTerms{},
            QuadTerms{ {1.0}, {resvar1}, {resvar2} },
            0.0 };
  }